

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O2

void __thiscall hrgls::API::~API(API *this)

{
  API_private *pAVar1;
  
  pAVar1 = this->m_private;
  if (pAVar1 == (API_private *)0x0) {
LAB_0010417d:
    pAVar1 = (API_private *)0x0;
  }
  else {
    if (pAVar1->m_api != (hrgls_API)0x0) {
      hrgls_APIDestroy();
      pAVar1 = this->m_private;
      if (pAVar1 == (API_private *)0x0) goto LAB_0010417d;
    }
    std::
    _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
    ::~_Rb_tree(&(pAVar1->m_status)._M_t);
  }
  operator_delete(pAVar1);
  return;
}

Assistant:

API::~API()
  {
    // Destroy any API object we created.
    if (m_private && m_private->m_api) {
      hrgls_APIDestroy(m_private->m_api);
    }
    delete m_private;
  }